

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgttb(fitsfile *fptr,LONGLONG *rowlen,LONGLONG *nrows,LONGLONG *pcount,long *tfields,
          int *status)

{
  int iVar1;
  long *in_R8;
  uint *in_R9;
  int *in_stack_00000118;
  LONGLONG *in_stack_00000120;
  char *in_stack_00000128;
  int in_stack_00000134;
  fitsfile *in_stack_00000138;
  undefined4 local_4;
  
  if ((int)*in_R9 < 1) {
    iVar1 = fftkyn(in_stack_00000138,in_stack_00000134,in_stack_00000128,(char *)in_stack_00000120,
                   in_stack_00000118);
    if (iVar1 == 0xd0) {
      *in_R9 = 0xde;
      local_4 = 0xde;
    }
    else if (*in_R9 == 0xd1) {
      *in_R9 = 0xd3;
      local_4 = 0xd3;
    }
    else {
      iVar1 = fftkyn(in_stack_00000138,in_stack_00000134,in_stack_00000128,(char *)in_stack_00000120
                     ,in_stack_00000118);
      if (iVar1 == 0xd0) {
        *in_R9 = 0xdf;
        local_4 = 0xdf;
      }
      else if (*in_R9 == 0xd1) {
        *in_R9 = 0xd4;
        local_4 = 0xd4;
      }
      else {
        iVar1 = ffgtknjj(in_stack_00000138,in_stack_00000134,in_stack_00000128,in_stack_00000120,
                         in_stack_00000118);
        if (iVar1 == 0xd0) {
          *in_R9 = 0xe0;
          local_4 = 0xe0;
        }
        else if (*in_R9 == 0xd1) {
          local_4 = (uint)(*in_R9 == 0xd5);
        }
        else {
          iVar1 = ffgtknjj(in_stack_00000138,in_stack_00000134,in_stack_00000128,in_stack_00000120,
                           in_stack_00000118);
          if (iVar1 == 0xd0) {
            *in_R9 = 0xe0;
            local_4 = 0xe0;
          }
          else if (*in_R9 == 0xd1) {
            local_4 = (uint)(*in_R9 == 0xd5);
          }
          else {
            iVar1 = ffgtknjj(in_stack_00000138,in_stack_00000134,in_stack_00000128,in_stack_00000120
                             ,in_stack_00000118);
            if (iVar1 == 0xd0) {
              *in_R9 = 0xe4;
              local_4 = 0xe4;
            }
            else if (*in_R9 == 0xd1) {
              *in_R9 = 0xd6;
              local_4 = 0xd6;
            }
            else {
              iVar1 = fftkyn(in_stack_00000138,in_stack_00000134,in_stack_00000128,
                             (char *)in_stack_00000120,in_stack_00000118);
              if (iVar1 == 0xd0) {
                *in_R9 = 0xe5;
                local_4 = 0xe5;
              }
              else if (*in_R9 == 0xd1) {
                *in_R9 = 0xd7;
                local_4 = 0xd7;
              }
              else {
                iVar1 = ffgtkn(in_stack_00000138,in_stack_00000134,in_stack_00000128,
                               in_stack_00000120,in_stack_00000118);
                if (iVar1 == 0xd0) {
                  *in_R9 = 0xe6;
                  local_4 = 0xe6;
                }
                else if ((*in_R9 == 0xd1) || (999 < *in_R8)) {
                  local_4 = (uint)(*in_R9 == 0xd8);
                }
                else {
                  if (0 < (int)*in_R9) {
                    ffpmsg((char *)0x1d2ca6);
                  }
                  local_4 = *in_R9;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgttb(fitsfile *fptr,      /* I - FITS file pointer*/
           LONGLONG *rowlen,        /* O - length of a table row, in bytes */
           LONGLONG *nrows,         /* O - number of rows in the table */
           LONGLONG *pcount,    /* O - value of PCOUNT keyword */
           long *tfields,       /* O - number of fields in the table */
           int *status)         /* IO - error status    */
{
/*
  Get and Test TaBle;
  Test that this is a legal ASCII or binary table and get some keyword values.
  We assume that the calling routine has already tested the 1st keyword
  of the extension to ensure that this is really a table extension.
*/
    if (*status > 0)
        return(*status);

    if (fftkyn(fptr, 2, "BITPIX", "8", status) == BAD_ORDER) /* 2nd keyword */
        return(*status = NO_BITPIX);  /* keyword not BITPIX */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_BITPIX); /* value != 8 */

    if (fftkyn(fptr, 3, "NAXIS", "2", status) == BAD_ORDER) /* 3rd keyword */
        return(*status = NO_NAXIS);  /* keyword not NAXIS */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_NAXIS); /* value != 2 */

    if (ffgtknjj(fptr, 4, "NAXIS1", rowlen, status) == BAD_ORDER) /* 4th key */
        return(*status = NO_NAXES);  /* keyword not NAXIS1 */
    else if (*status == NOT_POS_INT)
        return(*status == BAD_NAXES); /* bad NAXIS1 value */

    if (ffgtknjj(fptr, 5, "NAXIS2", nrows, status) == BAD_ORDER) /* 5th key */
        return(*status = NO_NAXES);  /* keyword not NAXIS2 */
    else if (*status == NOT_POS_INT)
        return(*status == BAD_NAXES); /* bad NAXIS2 value */

    if (ffgtknjj(fptr, 6, "PCOUNT", pcount, status) == BAD_ORDER) /* 6th key */
        return(*status = NO_PCOUNT);  /* keyword not PCOUNT */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_PCOUNT); /* bad PCOUNT value */

    if (fftkyn(fptr, 7, "GCOUNT", "1", status) == BAD_ORDER) /* 7th keyword */
        return(*status = NO_GCOUNT);  /* keyword not GCOUNT */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_GCOUNT); /* value != 1 */

    if (ffgtkn(fptr, 8, "TFIELDS", tfields, status) == BAD_ORDER) /* 8th key*/
        return(*status = NO_TFIELDS);  /* keyword not TFIELDS */
    else if (*status == NOT_POS_INT || *tfields > 999)
        return(*status == BAD_TFIELDS); /* bad TFIELDS value */


    if (*status > 0)
       ffpmsg(
       "Error reading required keywords in the table header (FTGTTB).");

    return(*status);
}